

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O3

void __thiscall OpenMD::MoleculeStamp::checkTorsions(MoleculeStamp *this)

{
  _Tuple_impl<2UL,_int,_int> _Var1;
  int iVar2;
  _Head_base<3UL,_int,_false> _Var3;
  _Tuple_impl<3UL,_int> _Var4;
  pointer piVar5;
  long lVar6;
  pointer ppAVar7;
  AtomStamp *pAVar8;
  pointer pcVar9;
  _Tuple_impl<2UL,_int,_int> _Var10;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar11;
  bool bVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  _Alloc_hider _Var15;
  pointer ppTVar16;
  iterator iVar17;
  TorsionStamp *this_00;
  _Rb_tree_node_base *p_Var18;
  _Base_ptr p_Var19;
  pointer ppBVar20;
  ostream *poVar21;
  OpenMDException *pOVar22;
  int __tmp;
  pointer ppTVar23;
  pointer ppBVar24;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  vector<int,_std::allocator<int>_> *cont_02;
  long lVar25;
  ulong uVar26;
  _Rb_tree_color _Var27;
  int ghostIndex;
  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  allTorsions;
  vector<int,_std::allocator<int>_> torsionAtoms;
  vector<int,_std::allocator<int>_> rigidSet;
  ostringstream oss;
  undefined1 local_270 [8];
  _Head_base<1UL,_int,_false> local_268;
  _Head_base<0UL,_int,_false> _Stack_264;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  undefined1 local_250 [32];
  _Base_ptr local_230;
  size_t local_228;
  string local_220;
  vector<int,_std::allocator<int>_> local_200;
  _Base_ptr local_1e8;
  long local_1e0;
  undefined1 local_1d8 [12];
  _Head_base<2UL,_int,_false> _Stack_1cc;
  ulong local_1c0;
  AtomStamp *local_1b8;
  _Base_ptr local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ppTVar16 = (this->torsionStamps_).
             super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppTVar23 = (this->torsionStamps_).
             super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar23 != ppTVar16) {
    lVar25 = 0;
    uVar26 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_220,
                 (vector<int,_std::allocator<int>_> *)
                 (*(long *)((long)ppTVar16 + (lVar25 >> 0x1d)) + 0x98));
      local_250._8_8_ =
           ((long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      _Var13 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>>
                         (local_220._M_dataplus._M_p,local_220._M_string_length,local_250);
      local_250._0_8_ = (pointer)0x0;
      _Var14 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>>
                         (local_220._M_dataplus._M_p,local_220._M_string_length,local_250);
      if ((_Var13._M_current != (int *)local_220._M_string_length) ||
         (_Var14._M_current != (int *)local_220._M_string_length)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar9 = (this->Name).data_._M_dataplus._M_p;
        local_250._0_8_ = local_250 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_250,pcVar9,pcVar9 + (this->Name).data_._M_string_length);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,": atoms of torsion",0x12);
        containerToString<std::vector<int,std::allocator<int>>>
                  ((string *)local_270,(OpenMD *)&local_220,cont_00);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar21,(char *)local_270,
                             CONCAT44(_Stack_264._M_head_impl,local_268._M_head_impl));
        std::__ostream_insert<char,std::char_traits<char>>(poVar21," have invalid indices\n",0x16);
        if (local_270 != (undefined1  [8])&local_260) {
          operator_delete((void *)local_270,local_260._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
          operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
        }
        pOVar22 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar22,(string *)local_250);
        __cxa_throw(pOVar22,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      bVar12 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                         ((vector<int,_std::allocator<int>_> *)&local_220);
      if (bVar12) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar9 = (this->Name).data_._M_dataplus._M_p;
        local_250._0_8_ = local_250 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_250,pcVar9,pcVar9 + (this->Name).data_._M_string_length);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21," : atoms of torsion",0x13);
        containerToString<std::vector<int,std::allocator<int>>>
                  ((string *)local_270,(OpenMD *)&local_220,cont_01);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar21,(char *)local_270,
                             CONCAT44(_Stack_264._M_head_impl,local_268._M_head_impl));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar21," have duplicated indices\n",0x19);
        if (local_270 != (undefined1  [8])&local_260) {
          operator_delete((void *)local_270,local_260._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
          operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
        }
        pOVar22 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar22,(string *)local_250);
        __cxa_throw(pOVar22,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      if ((int *)local_220._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_220._M_dataplus._M_p,
                        local_220.field_2._M_allocated_capacity - (long)local_220._M_dataplus._M_p);
      }
      uVar26 = uVar26 + 1;
      ppTVar16 = (this->torsionStamps_).
                 super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar23 = (this->torsionStamps_).
                 super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar25 = lVar25 + 0x100000000;
    } while (uVar26 < (ulong)((long)ppTVar23 - (long)ppTVar16 >> 3));
  }
  if (ppTVar23 == ppTVar16) {
    local_250._24_8_ = local_250 + 8;
    local_250._8_8_ = local_250._8_8_ & 0xffffffff00000000;
    local_250._16_8_ = (_Base_ptr)0x0;
    local_228 = 0;
    local_230 = (_Base_ptr)local_250._24_8_;
    local_1e8 = (_Base_ptr)local_250._24_8_;
  }
  else {
    uVar26 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_220,&ppTVar16[(int)uVar26]->members_);
      local_250._0_8_ = local_250._0_8_ & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_200,
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                 (value_type_conflict2 *)local_250,(allocator_type *)local_270);
      if (local_220._M_dataplus._M_p != (pointer)local_220._M_string_length) {
        piVar5 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        _Var15._M_p = local_220._M_dataplus._M_p;
        do {
          lVar25 = (long)piVar5[*(int *)_Var15._M_p];
          if ((-1 < lVar25) &&
             (iVar2 = ((_Tuple_impl<3UL,_int> *)
                      local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start)[lVar25].super__Head_base<3UL,_int,_false>.
                      _M_head_impl,
             ((_Tuple_impl<3UL,_int> *)
             local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start)[lVar25].super__Head_base<3UL,_int,_false>._M_head_impl = iVar2 + 1,
             2 < iVar2)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Error in Molecule ",0x12);
            pcVar9 = (this->Name).data_._M_dataplus._M_p;
            local_250._0_8_ = local_250 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_250,pcVar9,pcVar9 + (this->Name).data_._M_string_length);
            poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_250._0_8_,local_250._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,": torsion",9);
            containerToString<std::vector<int,std::allocator<int>>>
                      ((string *)local_270,(OpenMD *)&local_220,cont);
            poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar21,(char *)local_270,
                                 CONCAT44(_Stack_264._M_head_impl,local_268._M_head_impl));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar21,"has four atoms on the same rigid body\n",0x26);
            if (local_270 != (undefined1  [8])&local_260) {
              operator_delete((void *)local_270,local_260._M_allocated_capacity + 1);
            }
            if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
              operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
            }
            pOVar22 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(pOVar22,(string *)local_250);
            __cxa_throw(pOVar22,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
          _Var15._M_p = _Var15._M_p + 4;
        } while (_Var15._M_p != (pointer)local_220._M_string_length);
      }
      if ((_Tuple_impl<2UL,_int,_int> *)
          local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (_Tuple_impl<2UL,_int,_int> *)0x0) {
        operator_delete(local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((int *)local_220._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_220._M_dataplus._M_p,
                        local_220.field_2._M_allocated_capacity - (long)local_220._M_dataplus._M_p);
      }
      uVar26 = uVar26 + 1;
      ppTVar16 = (this->torsionStamps_).
                 super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar23 = (this->torsionStamps_).
                 super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar26 < (ulong)((long)ppTVar23 - (long)ppTVar16 >> 3));
    local_250._24_8_ = local_250 + 8;
    local_250._8_8_ = local_250._8_8_ & 0xffffffff00000000;
    local_250._16_8_ = (_Base_ptr)0x0;
    local_228 = 0;
    local_230 = (_Base_ptr)local_250._24_8_;
    local_1e8 = (_Base_ptr)local_250._24_8_;
    if (ppTVar23 != ppTVar16) {
      lVar25 = 0;
      uVar26 = 0;
      do {
        lVar6 = *(long *)((long)ppTVar16 + (lVar25 >> 0x1d));
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_200,(vector<int,_std::allocator<int>_> *)(lVar6 + 0x98));
        if ((long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start == 0xc) {
          local_270._0_4_ = ((_Head_base<3UL,_int,_false> *)(lVar6 + 0x94))->_M_head_impl;
          _Var13 = std::
                   __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish,local_270);
          if (_Var13._M_current !=
              local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<int,_std::allocator<int>_>::insert
                      (&local_200,(const_iterator)_Var13._M_current,
                       (value_type_conflict2 *)local_270);
          }
        }
        _Var1 = *(_Tuple_impl<2UL,_int,_int> *)
                 ((long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 8);
        local_1d8._4_4_ =
             (int)_Var1.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
        local_1d8._0_4_ =
             (_Head_base<3UL,_int,_false>)
             (_Head_base<3UL,_int,_false>)
             _Var1.super__Head_base<2UL,_int,_false>._M_head_impl._M_head_impl;
        _Stack_1cc._M_head_impl =
             (((_Tuple_impl<3UL,_int> *)
              local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start)->super__Head_base<3UL,_int,_false>)._M_head_impl;
        _Var10.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
             (_Head_base<3UL,_int,_false>)
             local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[0];
        _Var10.super__Head_base<2UL,_int,_false>._M_head_impl =
             local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[1];
        local_1d8._8_4_ =
             ((_Head_base<2UL,_int,_false> *)
             ((long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + 4))->_M_head_impl;
        if (_Var1.super__Head_base<2UL,_int,_false>._M_head_impl._M_head_impl <
            _Stack_1cc._M_head_impl) {
          local_1d8._0_8_ = _Var10;
          unique0x1000128c = _Var1;
        }
        iVar17 = std::
                 _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                 ::find((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                         *)local_250,(key_type *)local_1d8);
        if (iVar17._M_node != (_Base_ptr)(local_250 + 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar9 = (this->Name).data_._M_dataplus._M_p;
          local_270 = (undefined1  [8])&local_260;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_270,pcVar9,pcVar9 + (this->Name).data_._M_string_length);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_270,
                               CONCAT44(_Stack_264._M_head_impl,local_268._M_head_impl));
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,"Torsion",7);
          containerToString<std::vector<int,std::allocator<int>>>
                    (&local_220,(OpenMD *)&local_200,cont_02);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar21,local_220._M_dataplus._M_p,local_220._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar21," appears multiple times\n",0x18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          if (local_270 != (undefined1  [8])&local_260) {
            operator_delete((void *)local_270,local_260._M_allocated_capacity + 1);
          }
          pOVar22 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar22,(string *)local_270);
          __cxa_throw(pOVar22,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        std::
        _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
        ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                  ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                    *)local_250,(key_type *)local_1d8);
        if ((_Tuple_impl<2UL,_int,_int> *)
            local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (_Tuple_impl<2UL,_int,_int> *)0x0) {
          operator_delete(local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        uVar26 = uVar26 + 1;
        ppTVar16 = (this->torsionStamps_).
                   super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        lVar25 = lVar25 + 0x100000000;
      } while (uVar26 < (ulong)((long)(this->torsionStamps_).
                                      super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar16 >>
                               3));
    }
  }
  ppBVar20 = (this->bondStamps_).
             super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppBVar24 = (this->bondStamps_).
             super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppBVar24 != ppBVar20) {
    uVar26 = 0;
    do {
      _Var3._M_head_impl = ppBVar20[(int)uVar26]->a;
      ppAVar7 = (this->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pAVar8 = ppAVar7[_Var3._M_head_impl];
      p_Var19 = *(_Base_ptr *)((long)&(pAVar8->bondedAtoms_)._M_t._M_impl + 0x18);
      local_1b0 = (_Base_ptr)((long)&(pAVar8->bondedAtoms_)._M_t._M_impl + 8);
      if ((p_Var19 != local_1b0) && (_Var27 = p_Var19[1]._M_color, _Var27 != ~_S_red)) {
        local_1e0 = (long)ppBVar20[(int)uVar26]->b;
        local_1b8 = ppAVar7[local_1e0];
        psVar11 = &local_1b8->bondedAtoms_;
        local_1c0 = uVar26;
        do {
          if (_Var27 != (_Rb_tree_color)local_1e0) {
            for (p_Var18 = *(_Base_ptr *)((long)&(local_1b8->bondedAtoms_)._M_t._M_impl + 0x18);
                (p_Var18 != (_Rb_tree_node_base *)((long)&(psVar11->_M_t)._M_impl + 8U) &&
                (_Var4.super__Head_base<3UL,_int,_false>._M_head_impl =
                      (_Head_base<3UL,_int,_false>)p_Var18[1]._M_color,
                _Var4.super__Head_base<3UL,_int,_false>._M_head_impl != -1));
                p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
              if (_Var4.super__Head_base<3UL,_int,_false>._M_head_impl !=
                  (_Head_base<3UL,_int,_false>)_Var3._M_head_impl) {
                local_270._4_4_ = (int)local_1e0;
                local_270._0_4_ = _Var4.super__Head_base<3UL,_int,_false>._M_head_impl;
                local_268._M_head_impl = _Var3._M_head_impl;
                _Stack_264._M_head_impl = _Var27;
                iVar17 = std::
                         _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                         ::find((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                 *)local_250,(key_type *)local_270);
                if (iVar17._M_node == local_1e8) {
                  std::
                  _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                  ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                            ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                              *)local_250,(tuple<int,_int,_int,_int> *)local_270);
                  this_00 = (TorsionStamp *)operator_new(0xf0);
                  TorsionStamp::TorsionStamp(this_00);
                  TorsionStamp::setMembers(this_00,(tuple<int,_int,_int,_int> *)local_270);
                  addTorsionStamp(this,this_00);
                }
              }
            }
          }
          p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
        } while ((p_Var19 != local_1b0) && (_Var27 = p_Var19[1]._M_color, _Var27 != ~_S_red));
        ppBVar20 = (this->bondStamps_).
                   super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppBVar24 = (this->bondStamps_).
                   super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        uVar26 = local_1c0;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < (ulong)((long)ppBVar24 - (long)ppBVar20 >> 3));
  }
  std::
  _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
               *)local_250);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void MoleculeStamp::checkTorsions() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int>::iterator j =
          std::find_if(torsionAtoms.begin(), torsionAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(torsionAtoms.begin(), torsionAtoms.end(),
                       std::bind(std::less<int>(), std::placeholders::_1, 0));

      if (j != torsionAtoms.end() || k != torsionAtoms.end()) {
        oss << "Error in Molecule " << getName() << ": atoms of torsion"
            << containerToString(torsionAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }
      if (hasDuplicateElement(torsionAtoms)) {
        oss << "Error in Molecule " << getName() << " : atoms of torsion"
            << containerToString(torsionAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = torsionAtoms.begin(); j != torsionAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 3) {
            oss << "Error in Molecule " << getName() << ": torsion"
                << containerToString(torsionAtoms)
                << "has four atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int, int>> allTorsions;
    std::set<std::tuple<int, int, int, int>>::iterator iter;

    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp = getTorsionStamp(i);
      std::vector<int> torsion   = torsionStamp->getMembers();
      if (torsion.size() == 3) {
        int ghostIndex = torsionStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(torsion.begin(), torsion.end(), ghostIndex);
        if (j != torsion.end()) { torsion.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int, int> torsionTuple {torsion[0], torsion[1],
                                                   torsion[2], torsion[3]};
      auto& [first, second, third, fourth] = torsionTuple;

      if (first > fourth) {
        std::swap(first, fourth);
        std::swap(second, third);
      }

      iter = allTorsions.find(torsionTuple);
      if (iter == allTorsions.end()) {
        allTorsions.insert(torsionTuple);
      } else {
        oss << "Error in Molecule " << getName() << ": "
            << "Torsion" << containerToString(torsion)
            << " appears multiple times\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      int b                = bondStamp->getA();
      int c                = bondStamp->getB();

      AtomStamp* atomB = getAtomStamp(b);
      AtomStamp* atomC = getAtomStamp(c);

      AtomStamp::AtomIter ai2;
      AtomStamp::AtomIter ai3;

      for (int a = atomB->getFirstBondedAtom(ai2); a != -1;
           a     = atomB->getNextBondedAtom(ai2)) {
        if (a == c) continue;

        for (int d = atomC->getFirstBondedAtom(ai3); d != -1;
             d     = atomC->getNextBondedAtom(ai3)) {
          if (d == b) continue;

          std::tuple<int, int, int, int> newTorsion {a, b, c, d};
          auto [first, second, third, fourth] = newTorsion;

          // make sure the first element is always less than or equal
          // to the fourth element in IntTuple4
          if (first > fourth) {
            std::swap(first, fourth);
            std::swap(second, third);
          }

          if (allTorsions.find(newTorsion) == allTorsions.end()) {
            allTorsions.insert(newTorsion);
            TorsionStamp* newTorsionStamp = new TorsionStamp();
            newTorsionStamp->setMembers(newTorsion);
            addTorsionStamp(newTorsionStamp);
          }
        }
      }
    }
  }